

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_Limb::Activate(RS_Limb *this,string *motor_name,double time,double val)

{
  undefined1 auVar1 [16];
  iterator iVar2;
  ostream *poVar3;
  undefined1 auVar4 [16];
  undefined8 in_XMM1_Qb;
  shared_ptr<chrono::ChFunction_Setpoint> fun;
  shared_ptr<chrono::ChFunction> local_48;
  double local_38;
  undefined8 uStack_30;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_38 = val;
  uStack_30 = in_XMM1_Qb;
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_motors)._M_h,motor_name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_20,
               (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_true>
                                ._M_cur + 0x28) + 0x250));
    std::static_pointer_cast<chrono::ChFunction_Setpoint,chrono::ChFunction>(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    auVar1._8_8_ = uStack_30;
    auVar1._0_8_ = local_38;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar4 = vxorpd_avx512vl(auVar1,auVar4);
    (**(code **)(*(long *)local_48.
                          super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 0xd0))(auVar4._0_8_,time);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Limb::Activate -- Unknown motor ");
  poVar3 = std::operator<<(poVar3,(string *)motor_name);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void RS_Limb::Activate(const std::string& motor_name, double time, double val) {
    auto itr = m_motors.find(motor_name);
    if (itr == m_motors.end()) {
        std::cout << "Limb::Activate -- Unknown motor " << motor_name << std::endl;
        return;
    }

    // Note: currently hard-coded for angle motor
    auto fun = std::static_pointer_cast<ChFunction_Setpoint>(itr->second->GetMotorFunction());
    fun->SetSetpoint(-val, time);
}